

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
exr_attr_list_remove(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *attr)

{
  uint uVar1;
  exr_attribute_t **ppeVar2;
  exr_attribute_t *peVar3;
  exr_result_t eVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (attr == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "NULL attribute passed to remove";
  }
  else if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "Invalid list pointer to remove attribute";
  }
  else {
    uVar1 = list->num_attributes;
    if (0 < (long)(int)uVar1) {
      ppeVar2 = list->entries;
      uVar7 = 0;
      do {
        if (ppeVar2[uVar7] == attr) {
          ppeVar2[uVar7] = (exr_attribute_t *)0x0;
          uVar8 = uVar1 - 1;
          if ((int)uVar7 < (int)uVar8) {
            do {
              ppeVar2[uVar7] = ppeVar2[uVar7 + 1];
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          list->num_attributes = uVar8;
          ppeVar2 = list->sorted_entries;
          uVar7 = 0;
          iVar6 = 0;
          do {
            peVar3 = ppeVar2[uVar7];
            if (peVar3 != attr) {
              lVar9 = (long)iVar6;
              iVar6 = iVar6 + 1;
              ppeVar2[lVar9] = peVar3;
            }
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
          eVar4 = attr_destroy(ctxt,attr);
          return eVar4;
        }
        uVar7 = uVar7 + 1;
      } while ((long)(int)uVar1 != uVar7);
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "Attribute not in list";
  }
  eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar5);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_list_remove (
    exr_context_t ctxt, exr_attribute_list_t* list, exr_attribute_t* attr)
{
    int               cattrsz, attridx = -1;
    exr_attribute_t** attrs;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!attr)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL attribute passed to remove");
    }

    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to remove attribute");
    }

    cattrsz = list->num_attributes;
    attrs   = list->entries;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr)
        {
            attridx = i;
            break;
        }
    }

    if (attridx == -1)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Attribute not in list");
    }

    list->entries[attridx] = NULL;
    for (int i = attridx; i < (cattrsz - 1); ++i)
        attrs[i] = attrs[i + 1];
    list->num_attributes = cattrsz - 1;

    attrs   = list->sorted_entries;
    attridx = 0;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr) continue;
        attrs[attridx++] = attrs[i];
    }

    return attr_destroy (ctxt, attr);
}